

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_from_string__large(void)

{
  _Bool _Var1;
  undefined8 uVar2;
  char *pcVar3;
  bson_decimal128_t full_house;
  bson_decimal128_t tiniest;
  bson_decimal128_t largest;
  bson_decimal128_t all_digits;
  bson_decimal128_t large;
  
  bson_decimal128_from_string("12345689012345789012345",&large);
  bson_decimal128_from_string("1234567890123456789012345678901234",&all_digits);
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&largest);
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&tiniest);
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&full_house);
  _Var1 = decimal128_equal(&large,0x304000000000029d,0x42da3a76f9e0d979);
  if (_Var1) {
    _Var1 = decimal128_equal(&all_digits,0x30403cde6fff9732,0xde825cd07e96aff2);
    if (_Var1) {
      _Var1 = decimal128_equal(&largest,0x5fffed09bead87c0,0x378d8e63ffffffff);
      if (_Var1) {
        _Var1 = decimal128_equal(&tiniest,0x1ed09bead87c0,0x378d8e63ffffffff);
        if (_Var1) {
          _Var1 = decimal128_equal(&full_house,0x3040ffffffffffff,0xffffffffffffffff);
          if (_Var1) {
            return;
          }
          pcVar3 = "decimal128_equal (&full_house, 0x3040ffffffffffff, 0xffffffffffffffff)";
          uVar2 = 0x1db;
        }
        else {
          pcVar3 = "decimal128_equal (&tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff)";
          uVar2 = 0x1d9;
        }
      }
      else {
        pcVar3 = "decimal128_equal (&largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff)";
        uVar2 = 0x1d8;
      }
    }
    else {
      pcVar3 = "decimal128_equal (&all_digits, 0x30403cde6fff9732, 0xde825cd07e96aff2)";
      uVar2 = 0x1d7;
    }
  }
  else {
    pcVar3 = "decimal128_equal (&large, 0x304000000000029d, 0x42da3a76f9e0d979)";
    uVar2 = 0x1d5;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar2,"test_decimal128_from_string__large",pcVar3);
  abort();
}

Assistant:

static void
test_decimal128_from_string__large (void)
{
   bson_decimal128_t large;
   bson_decimal128_t all_digits;
   bson_decimal128_t largest;
   bson_decimal128_t tiniest;
   bson_decimal128_t full_house;

   bson_decimal128_from_string ("12345689012345789012345", &large);
   bson_decimal128_from_string ("1234567890123456789012345678901234",
                                &all_digits);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E+6144",
                                &largest);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E-6143",
                                &tiniest);
   bson_decimal128_from_string ("5.192296858534827628530496329220095E+33",
                                &full_house);

   BSON_ASSERT (decimal128_equal (&large, 0x304000000000029d, 0x42da3a76f9e0d979));
   BSON_ASSERT (
      decimal128_equal (&all_digits, 0x30403cde6fff9732, 0xde825cd07e96aff2));
   BSON_ASSERT (decimal128_equal (&largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (decimal128_equal (&tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (
      decimal128_equal (&full_house, 0x3040ffffffffffff, 0xffffffffffffffff));
}